

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoProvider.cpp
# Opt level: O0

void InfoProvider::initGPUCount(void)

{
  reference pQVar1;
  QString *this;
  int local_e8;
  QFlags<Qt::SplitBehaviorFlags> local_e4;
  int i;
  QString local_c8;
  QString local_b0;
  undefined1 local_98 [8];
  QStringList names;
  QString local_78;
  QString local_50;
  QString local_38;
  QList<QString> local_20;
  
  QString::QString(&local_50,"nvidia-smi --query-gpu=count --format=csv,noheader");
  Utils::exec(&local_38,&local_50);
  QString::QString(&local_78,"\n");
  QFlags<Qt::SplitBehaviorFlags>::QFlags
            ((QFlags<Qt::SplitBehaviorFlags> *)((long)&names.d.size + 4),KeepEmptyParts);
  QString::split((QString *)&local_20,(QFlags_conflict *)&local_38,(CaseSensitivity)&local_78);
  pQVar1 = QList<QString>::operator[](&local_20,0);
  m_gpuCount = QString::toInt(pQVar1,(bool *)0x0,10);
  QList<QString>::~QList(&local_20);
  QString::~QString(&local_78);
  QString::~QString(&local_38);
  QString::~QString(&local_50);
  QVarLengthArray<QString,_256LL>::resize(&m_gpuNames,(long)m_gpuCount);
  QString::QString(&local_c8,"nvidia-smi --query-gpu=name --format=csv,noheader");
  Utils::exec(&local_b0,&local_c8);
  QString::QString((QString *)&i,"\n");
  QFlags<Qt::SplitBehaviorFlags>::QFlags(&local_e4,KeepEmptyParts);
  QString::split((QString *)local_98,(QFlags_conflict *)&local_b0,(CaseSensitivity)&i);
  QString::~QString((QString *)&i);
  QString::~QString(&local_b0);
  QString::~QString(&local_c8);
  for (local_e8 = 0; local_e8 < m_gpuCount; local_e8 = local_e8 + 1) {
    pQVar1 = QList<QString>::operator[]((QList<QString> *)local_98,(long)local_e8);
    this = QVarLengthArray<QString,_256LL>::operator[](&m_gpuNames,(long)local_e8);
    QString::operator=(this,pQVar1);
  }
  QVarLengthArray<InfoProvider::GPUInfo,_256LL>::resize(&m_info,(long)m_gpuCount);
  QList<QString>::~QList((QList<QString> *)local_98);
  return;
}

Assistant:

void InfoProvider::initGPUCount() {
    m_gpuCount = exec_cmd("nvidia-smi --query-gpu=count --format=csv,noheader").split("\n")[0].toInt();
    m_gpuNames.resize(m_gpuCount);

    auto names = exec_cmd("nvidia-smi --query-gpu=name --format=csv,noheader").split("\n");

    for (int i = 0; i < m_gpuCount; i++)
        m_gpuNames[i] = std::move(names[i]);

    m_info.resize(m_gpuCount);
}